

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_run(test_table *table)

{
  undefined8 local_18;
  uint64_t result;
  test_table *table_local;
  
  result = (uint64_t)table;
  (*ne_core_on_exit)((uint64_t *)0x0,test_on_exit,table);
  *(undefined1 *)(result + 0x48) = 1;
  *(undefined1 *)(result + 0x11) = 0;
  local_18 = 0;
  *(undefined8 **)(result + 0x40) = &local_18;
  test_all((test_table *)result);
  *(undefined1 *)(result + 0x11) = 1;
  *(undefined8 *)(result + 0x40) = 0;
  test_all((test_table *)result);
  return;
}

Assistant:

void test_run(test_table *table)
{
  // We register exit callbacks here since the callbacks are executed in LIFO
  // order and we want the library to have a change to register it's own exit
  // callbacks that will be called before the test exit.
  ne_core_on_exit(nullptr, &test_on_exit, table);

  table->success = NE_CORE_TRUE;
  table->is_final_run = NE_CORE_FALSE;
  uint64_t result = NE_CORE_RESULT_INVALID;
  table->result = &result;

  // Test everything with a valid result pointer.
  test_all(table);

  // Test everything with a null result pointer.
  table->is_final_run = NE_CORE_TRUE;
  table->result = nullptr;
  test_all(table);

  // Because of events, the test may continue well past this point so we can't
  // return a success or failure here.
}